

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

_Bool av1_rd_pick_partition
                (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                int mi_row,int mi_col,BLOCK_SIZE bsize,RD_STATS *rd_cost,RD_STATS best_rdc,
                PC_TREE *pc_tree,SIMPLE_MOTION_DATA_TREE *sms_tree,int64_t *none_rd,
                SB_MULTI_PASS_MODE multi_pass_mode,RD_RECT_PART_WIN_INFO *rect_part_win_info)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  long in_RDX;
  PARTITION_TYPE *pPVar4;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  BLOCK_SIZE in_stack_00000008;
  RD_STATS *in_stack_00000010;
  PARTITION_TYPE *in_stack_00000040;
  SIMPLE_MOTION_DATA_TREE *in_stack_00000048;
  undefined8 *in_stack_00000050;
  RUN_TYPE run_type;
  int emit_output;
  int pc_tree_dealloc;
  int inc_step_1 [2];
  int inc_step [2];
  int part4_search_allowed [2];
  int ab_partition_allowed;
  int prune_ext_part_state;
  int64_t part_split_rd;
  int64_t part_none_rd;
  double var_max_1;
  double var_min_1;
  _Bool prune_rect_part_using_4x4_var_deviation;
  _Bool bsize_at_least_16x16;
  uint pb_source_variance;
  int orig_rdmult;
  double var_max;
  double var_min;
  PartitionBlkParams blk_params;
  PartitionSearchState part_search_state;
  TokenExtra *tp_orig;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  TileInfo *tile_info;
  int num_planes;
  AV1_COMMON *cm;
  RD_STATS *rd_cost_00;
  undefined1 *puVar5;
  PARTITION_TYPE *pPVar6;
  undefined8 in_stack_fffffffffffffc00;
  buf_2d *ref;
  int cpi_00 [2];
  int aiVar7 [2];
  int src [2];
  int aiVar8 [2];
  PartitionSearchState *in_stack_fffffffffffffc18;
  undefined4 uVar9;
  SuperBlockEnc *in_stack_fffffffffffffc20;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  undefined4 in_stack_fffffffffffffc30;
  BLOCK_SIZE BVar11;
  int in_stack_fffffffffffffc34;
  int in_stack_fffffffffffffc38;
  uint in_stack_fffffffffffffc3c;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined4 in_stack_fffffffffffffc58;
  uint in_stack_fffffffffffffc5c;
  uint in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  MACROBLOCK *in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  MACROBLOCK *x_00;
  AV1_COMP *cpi_01;
  double local_378;
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  undefined6 in_stack_fffffffffffffc98;
  byte in_stack_fffffffffffffc9e;
  byte in_stack_fffffffffffffc9f;
  uint uVar12;
  int iVar13;
  ThreadData_conflict *in_stack_fffffffffffffca8;
  AV1_COMP *in_stack_fffffffffffffcb0;
  undefined1 local_344 [20];
  RUN_TYPE in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd1;
  BLOCK_SIZE bsize_00;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  TileDataEnc *in_stack_fffffffffffffce8;
  ThreadData_conflict *in_stack_fffffffffffffcf0;
  AV1_COMP *in_stack_fffffffffffffcf8;
  RD_SEARCH_MACROBLOCK_CONTEXT *in_stack_fffffffffffffd10;
  MACROBLOCK *in_stack_fffffffffffffd18;
  RD_STATS *in_stack_fffffffffffffd20;
  TileDataEnc *in_stack_fffffffffffffd28;
  ThreadData_conflict *in_stack_fffffffffffffd30;
  AV1_COMP *in_stack_fffffffffffffd38;
  PartitionSearchState *in_stack_fffffffffffffd40;
  RD_STATS *in_stack_fffffffffffffd48;
  RD_SEARCH_MACROBLOCK_CONTEXT *in_stack_fffffffffffffd50;
  PARTITION_TYPE in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd59;
  int in_stack_fffffffffffffd60 [2];
  int in_stack_fffffffffffffd68 [2];
  RECT_PART_TYPE in_stack_fffffffffffffd70;
  RECT_PART_TYPE in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd79;
  int in_stack_fffffffffffffd80 [2];
  int in_stack_fffffffffffffd88 [2];
  int in_stack_fffffffffffffd90 [2];
  ThreadData_conflict *in_stack_fffffffffffffd98;
  AV1_COMP *in_stack_fffffffffffffda0;
  TileDataEnc *in_stack_fffffffffffffda8;
  ThreadData_conflict *in_stack_fffffffffffffdb0;
  AV1_COMP *in_stack_fffffffffffffdb8;
  SIMPLE_MOTION_DATA_TREE *in_stack_fffffffffffffde0;
  RD_SEARCH_MACROBLOCK_CONTEXT *in_stack_fffffffffffffde8;
  PartitionSearchState *in_stack_fffffffffffffdf0;
  PartitionSearchState *in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  uint in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  AB_PART_TYPE in_stack_fffffffffffffe20;
  AB_PART_TYPE in_stack_fffffffffffffe28;
  byte local_1d4;
  undefined1 local_1c8 [336];
  long local_78;
  long local_70;
  long local_68;
  int local_5c;
  AV1_COMMON *local_58;
  int local_50;
  uint local_4c;
  long local_40;
  long local_38;
  long local_30;
  _Bool local_21;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffc00 >> 0x20);
  cpi_00 = (int  [2])&stack0x00000018;
  local_58 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_50 = in_R9D;
  local_4c = in_R8D;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  local_5c = av1_num_planes(local_58);
  local_68 = local_40;
  local_70 = local_38;
  local_78 = local_38 + 0x1a0;
  init_partition_search_state_params
            ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
             (AV1_COMP *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
             (PartitionSearchState *)cpi_00,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
             (BLOCK_SIZE)((uint)in_stack_fffffffffffffc34 >> 0x18));
  memcpy(local_344,&stack0xfffffffffffffcf0,0x2c);
  set_sms_tree_partitioning(in_stack_00000048,'\0');
  if (*(long *)((long)cpi_00 + 0x10) < 0) {
    av1_invalid_rd_stats(in_stack_00000010);
  }
  else {
    if (in_stack_00000008 == local_58->seq_params->sb_size) {
      *(undefined4 *)(local_70 + 0x18c0c) = 0;
    }
    if (in_stack_00000050 != (undefined8 *)0x0) {
      *in_stack_00000050 = 0;
    }
    _Var2 = av1_blk_has_rows_and_cols((PartitionBlkParams *)local_344);
    if (!_Var2) {
      set_partition_cost_for_edge_blk
                ((AV1_COMMON *)cpi_00,
                 (PartitionSearchState *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    }
    if (*(BLOCK_SIZE *)(local_30 + 0x60968) < in_stack_00000008) {
      in_stack_fffffffffffffe08 =
           ((in_stack_fffffffffffffcdc != 0 ^ 0xffU) & 1) & in_stack_fffffffffffffe08;
      in_stack_fffffffffffffe0c =
           ((in_stack_fffffffffffffce0 != 0 ^ 0xffU) & 1) & in_stack_fffffffffffffe0c;
    }
    av1_set_offsets((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                    (TileInfo *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                    (MACROBLOCK *)cpi_00,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                    (BLOCK_SIZE)((uint)in_stack_fffffffffffffc34 >> 0x18));
    if ((*(char *)(local_30 + 0x42770) == '\x02') &&
       (in_stack_00000008 == local_58->seq_params->sb_size)) {
      log_sub_block_var((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        in_stack_fffffffffffffc68,
                        (BLOCK_SIZE)((uint)in_stack_fffffffffffffc64 >> 0x18),
                        (double *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                        (double *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      *(undefined4 *)(local_70 + 0x421c) = 0x80;
      if (((double)in_stack_fffffffffffffcb0 < 2.0) && (4.0 < (double)in_stack_fffffffffffffca8)) {
        if ((double)in_stack_fffffffffffffca8 - (double)in_stack_fffffffffffffcb0 <= 8.0) {
          *(int *)(local_70 + 0x421c) =
               *(int *)(local_70 + 0x421c) -
               (int)(((double)in_stack_fffffffffffffca8 - (double)in_stack_fffffffffffffcb0) * 6.0);
        }
        else {
          *(int *)(local_70 + 0x421c) = *(int *)(local_70 + 0x421c) + -0x30;
        }
      }
    }
    iVar13 = *(int *)(local_70 + 0x4218);
    rd_cost_00 = (RD_STATS *)0x0;
    setup_block_rdmult((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                       (int)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                       (int)in_stack_fffffffffffffc20,
                       (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc18 >> 0x38),
                       (AQ_MODE)((ulong)in_stack_fffffffffffffc18 >> 0x30),(MB_MODE_INFO *)cpi_00);
    av1_rd_cost_update(iVar3,rd_cost_00);
    if ((in_stack_00000008 == BLOCK_16X16) && (*(int *)(local_30 + 0x81330) != 0)) {
      iVar3 = av1_log_block_var((AV1_COMP *)cpi_00,
                                (MACROBLOCK *)
                                CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                                (BLOCK_SIZE)((uint)in_stack_fffffffffffffc34 >> 0x18));
      *(int *)(local_70 + 0x4228) = iVar3;
    }
    *(TXFM_CONTEXT **)(local_78 + 0x1fc0) =
         (local_58->above_contexts).txfm[*(int *)(local_68 + 0x10)] + local_50;
    *(long *)(local_78 + 0x1fc8) = local_78 + 0x1fd0 + (long)(int)(local_4c & 0x1f);
    av1_save_context((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (RD_SEARCH_MACROBLOCK_CONTEXT *)
                     CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                     (int)((ulong)in_stack_fffffffffffffc20 >> 0x20),(int)in_stack_fffffffffffffc20,
                     (BLOCK_SIZE)((ulong)in_stack_fffffffffffffc18 >> 0x38),
                     (int)in_stack_fffffffffffffc18);
    av1_prune_partitions_before_search
              ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,
               (SIMPLE_MOTION_DATA_TREE *)
               CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               (PartitionSearchState *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
              );
    av1_prune_partitions_by_max_min_bsize(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    while( true ) {
      if (*(int *)(local_70 + 0x18c0c) != 0) {
        reset_part_limitations
                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (PartitionSearchState *)
                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        av1_prune_partitions_by_max_min_bsize(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        iVar3 = frame_is_intra_only(local_58);
        if ((iVar3 != 0) && (in_stack_00000008 == BLOCK_64X64)) {
          (in_stack_fffffffffffffce8->tile_info).mi_row_start = 0;
          (in_stack_fffffffffffffce8->tile_info).mi_row_end = 0;
        }
      }
      BVar11 = (BLOCK_SIZE)((uint)in_stack_fffffffffffffc30 >> 0x18);
      uVar12 = 0xffffffff;
      if (*(char *)(local_30 + 0x42770) == '\x02') {
        in_stack_fffffffffffffc9f = BLOCK_16X8 < in_stack_00000008;
        uVar1 = in_stack_fffffffffffffc3c & 0xffffff;
        if ((*(byte *)(local_30 + 0x609c0) & 1) != 0) {
          uVar1 = CONCAT13(*(int *)(local_70 + 0x18c0c) != 0,(int3)in_stack_fffffffffffffc3c) ^
                  0xff000000;
        }
        in_stack_fffffffffffffc3c = uVar1;
        in_stack_fffffffffffffc9e = (byte)(in_stack_fffffffffffffc3c >> 0x18) & 1;
        if (((bool)in_stack_fffffffffffffc9f) || ((in_stack_fffffffffffffc3c & 0x1000000) != 0)) {
          log_sub_block_var((AV1_COMP *)
                            CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                            in_stack_fffffffffffffc68,
                            (BLOCK_SIZE)((uint)in_stack_fffffffffffffc64 >> 0x18),
                            (double *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                            (double *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))
          ;
          if (((in_stack_fffffffffffffc9f & 1) == 0) ||
             ((0.272 < (double)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90) ||
               (double)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90) == 0.272 ||
              (local_378 - (double)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90) <=
               3.0)))) {
            if (((in_stack_fffffffffffffc9e & 1) != 0) &&
               (local_378 - (double)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90) <
                3.0)) {
              in_stack_fffffffffffffe10 = 0;
            }
          }
          else {
            in_stack_fffffffffffffe04 = 0;
            in_stack_fffffffffffffe00 = 0;
          }
        }
      }
      cpi_01 = (AV1_COMP *)0x7fffffffffffffff;
      uVar9 = in_stack_00000050._4_4_;
      none_partition_search
                (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                 (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (PC_TREE *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (SIMPLE_MOTION_DATA_TREE *)
                 CONCAT71(in_stack_fffffffffffffcd1,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffd10,(PartitionSearchState *)in_stack_fffffffffffffd18,
                 in_stack_fffffffffffffd20,(uint *)in_stack_fffffffffffffd28,
                 (int64_t *)in_stack_fffffffffffffd30,(int64_t *)in_stack_fffffffffffffd38);
      x_00 = (MACROBLOCK *)0x7fffffffffffffff;
      uVar10 = (undefined4)((ulong)&stack0xfffffffffffffc78 >> 0x20);
      split_partition_search
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (TileDataEnc *)in_stack_fffffffffffffd90,(TokenExtra **)in_stack_fffffffffffffd88,
                 (MACROBLOCK *)in_stack_fffffffffffffd80,
                 (PC_TREE *)CONCAT71(in_stack_fffffffffffffd79,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,
                 (RD_STATS *)in_stack_fffffffffffffdf8,(SB_MULTI_PASS_MODE)in_stack_fffffffffffffe00
                 ,(int64_t *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      if ((((*(int *)(local_30 + 0x609c4) != 0) && (cpi_01 == (AV1_COMP *)0x7fffffffffffffff)) &&
          (x_00 == (MACROBLOCK *)0x7fffffffffffffff)) &&
         ((*(int *)(local_70 + 0x18c0c) == 0 && (in_stack_00000008 != local_58->seq_params->sb_size)
          ))) {
        in_stack_fffffffffffffe00 = 1;
      }
      if (((1 < *(int *)(local_30 + 0x609e0)) && (*(long *)(in_stack_00000040 + 8) != 0)) &&
         ((*(int *)(local_70 + 0x4208) < 0xc9 &&
          ((((iVar3 = is_inter_mode(*(PREDICTION_MODE *)(*(long *)(in_stack_00000040 + 8) + 2)),
             iVar3 != 0 &&
             (iVar3 = have_newmv_in_inter_mode
                                (*(PREDICTION_MODE *)(*(long *)(in_stack_00000040 + 8) + 2)),
             iVar3 == 0)) && (*(int *)(*(long *)(in_stack_00000040 + 8) + 0x1a4) != 0)) &&
           ((*(int *)(local_70 + 0x18c0c) == 0 && (BLOCK_16X8 < in_stack_00000008)))))))) {
        in_stack_fffffffffffffe10 = 0;
      }
      prune_partitions_after_split
                (cpi_01,x_00,
                 (SIMPLE_MOTION_DATA_TREE *)
                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 (PartitionSearchState *)in_stack_fffffffffffffc68,
                 (RD_STATS *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      puVar5 = local_1c8;
      ref = (buf_2d *)&stack0xfffffffffffffce8;
      aiVar7 = inc_step_1;
      src = cpi_00;
      rectangular_partition_search
                (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                 (TokenExtra **)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 (PC_TREE *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd50,
                 (PartitionSearchState *)
                 CONCAT71(in_stack_fffffffffffffd59,in_stack_fffffffffffffd58),
                 (RD_STATS *)in_stack_fffffffffffffd60,
                 (RD_RECT_PART_WIN_INFO *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd78);
      if (uVar12 == 0xffffffff) {
        av1_setup_src_planes
                  ((MACROBLOCK *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                   (YV12_BUFFER_CONFIG *)src,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                   in_stack_fffffffffffffc34,BVar11);
        uVar12 = av1_get_perpixel_variance_facade
                           ((AV1_COMP *)aiVar7,(MACROBLOCKD *)cpi_00,ref,
                            (BLOCK_SIZE)((ulong)puVar5 >> 0x38),(int)puVar5);
      }
      in_stack_fffffffffffffc74 =
           prune_ext_part_none_skippable
                     (*(PICK_MODE_CONTEXT **)(in_stack_00000040 + 8),*(int *)(local_70 + 0x18c0c),
                      *(int *)(local_30 + 0x609e0),in_stack_00000008);
      in_stack_fffffffffffffc70 =
           allow_ab_partition_search
                     ((PartitionSearchState *)
                      CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                      (PARTITION_SPEED_FEATURES *)src,
                      (PARTITION_TYPE)(in_stack_fffffffffffffc3c >> 0x18),in_stack_fffffffffffffc38,
                      in_stack_fffffffffffffc34,
                      CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      in_stack_fffffffffffffc18 = (PartitionSearchState *)CONCAT44(uVar9,uVar12);
      in_stack_fffffffffffffc20 = (SuperBlockEnc *)CONCAT44(uVar10,in_stack_fffffffffffffc70);
      in_stack_fffffffffffffc28 = 0;
      in_stack_fffffffffffffc30 = 3;
      pPVar6 = in_stack_00000040;
      aiVar7 = inc_step_1;
      ab_partitions_search
                (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                 (TokenExtra **)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->mb,
                 (RD_SEARCH_MACROBLOCK_CONTEXT *)in_stack_fffffffffffffd90,
                 (PC_TREE *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,
                 (RD_STATS *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (RD_RECT_PART_WIN_INFO *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe28);
      in_stack_fffffffffffffc68 = (MACROBLOCK *)0x100000001;
      pPVar4 = &stack0xfffffffffffffc68;
      BVar11 = (BLOCK_SIZE)((ulong)pPVar6 >> 0x38);
      prune_4_way_partition_search
                ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                 (PC_TREE *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (PartitionSearchState *)
                 CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),(RD_STATS *)src,
                 in_stack_fffffffffffffc3c,in_stack_fffffffffffffc70,(int *)x_00);
      aiVar8 = src;
      if ((in_stack_fffffffffffffe00 == 0) && ((int)in_stack_fffffffffffffc68 != 0)) {
        in_stack_fffffffffffffc60 =
             "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
             [(BLOCK_SIZE)in_stack_fffffffffffffce4] / 4;
        in_stack_fffffffffffffc64 = 0;
        pPVar4 = in_stack_00000040 + 0x90;
        in_stack_fffffffffffffc18 = (PartitionSearchState *)&stack0xfffffffffffffc60;
        in_stack_fffffffffffffc20 =
             (SuperBlockEnc *)CONCAT44((int)((ulong)in_stack_fffffffffffffc20 >> 0x20),8);
        pPVar6 = in_stack_00000040;
        rd_pick_4partition(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                           in_stack_fffffffffffffce8,
                           (TokenExtra **)
                           CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                           (MACROBLOCK *)
                           CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                           (RD_SEARCH_MACROBLOCK_CONTEXT *)
                           CONCAT71(in_stack_fffffffffffffcd1,in_stack_fffffffffffffcd0),
                           (PC_TREE *)in_stack_fffffffffffffd30,
                           (PICK_MODE_CONTEXT **)in_stack_fffffffffffffd38,in_stack_fffffffffffffd40
                           ,in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd50,
                           in_stack_fffffffffffffd58);
        BVar11 = (BLOCK_SIZE)((ulong)pPVar6 >> 0x38);
        aiVar7 = src;
      }
      cpi_00 = aiVar8;
      if (((in_stack_fffffffffffffe00 == 0) &&
          ((int)((ulong)in_stack_fffffffffffffc68 >> 0x20) != 0)) &&
         (in_stack_fffffffffffffce0 != 0)) {
        in_stack_fffffffffffffc58 = 0;
        in_stack_fffffffffffffc5c =
             "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [(BLOCK_SIZE)in_stack_fffffffffffffce4] / 4;
        pPVar4 = in_stack_00000040 + 0xb0;
        in_stack_fffffffffffffc18 = (PartitionSearchState *)&stack0xfffffffffffffc58;
        in_stack_fffffffffffffc20 =
             (SuperBlockEnc *)CONCAT44((int)((ulong)in_stack_fffffffffffffc20 >> 0x20),9);
        pPVar6 = in_stack_00000040;
        rd_pick_4partition(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                           in_stack_fffffffffffffce8,
                           (TokenExtra **)
                           CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                           (MACROBLOCK *)
                           CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                           (RD_SEARCH_MACROBLOCK_CONTEXT *)
                           CONCAT71(in_stack_fffffffffffffcd1,in_stack_fffffffffffffcd0),
                           (PC_TREE *)in_stack_fffffffffffffd30,
                           (PICK_MODE_CONTEXT **)in_stack_fffffffffffffd38,in_stack_fffffffffffffd40
                           ,in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd50,
                           in_stack_fffffffffffffd58);
        BVar11 = (BLOCK_SIZE)((ulong)pPVar6 >> 0x38);
        aiVar7 = aiVar8;
      }
      if ((in_stack_00000008 != local_58->seq_params->sb_size) || ((local_1d4 & 1) != 0)) break;
      *(undefined4 *)(local_70 + 0x18c0c) = 1;
    }
    memcpy(in_stack_00000010,(void *)cpi_00,0x28);
    bsize_00 = (BLOCK_SIZE)in_stack_fffffffffffffcd8;
    set_sms_tree_partitioning(in_stack_00000048,*in_stack_00000040);
    iVar3 = 0;
    if ((local_1d4 & 1) != 0) {
      if (in_stack_00000008 == local_58->seq_params->sb_size) {
        set_cb_offsets((uint16_t *)(local_70 + 0x4198),0,0);
        aiVar7[0] = 0;
        aiVar7[1] = 0;
        encode_sb(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                  (TileDataEnc *)CONCAT44(iVar13,uVar12),
                  (TokenExtra **)
                  CONCAT17(in_stack_fffffffffffffc9f,
                           CONCAT16(in_stack_fffffffffffffc9e,in_stack_fffffffffffffc98)),
                  in_stack_fffffffffffffc94,in_stack_fffffffffffffc90,in_stack_fffffffffffffcd0,
                  bsize_00,(PC_TREE *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                  (int *)in_stack_fffffffffffffce8);
        av1_free_pc_tree_recursive
                  ((PC_TREE *)in_stack_fffffffffffffc20,
                   (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),(int)in_stack_fffffffffffffc18,
                   aiVar7[1],aiVar7[0]._3_1_);
        in_stack_00000040 = (PARTITION_TYPE *)0x0;
        *(undefined8 *)(local_38 + 0x26e50) = 0;
        iVar3 = 1;
      }
      else {
        _Var2 = should_do_dry_run_encode_for_current_block
                          ((BLOCK_SIZE)((ulong)pPVar4 >> 0x30),(BLOCK_SIZE)((ulong)pPVar4 >> 0x28),
                           (int)pPVar4,BVar11);
        if (_Var2) {
          aiVar7[0] = 0;
          aiVar7[1] = 0;
          encode_sb(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                    (TileDataEnc *)CONCAT44(iVar13,uVar12),
                    (TokenExtra **)
                    CONCAT17(in_stack_fffffffffffffc9f,
                             CONCAT16(in_stack_fffffffffffffc9e,in_stack_fffffffffffffc98)),
                    in_stack_fffffffffffffc94,in_stack_fffffffffffffc90,in_stack_fffffffffffffcd0,
                    bsize_00,(PC_TREE *)
                             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    (int *)in_stack_fffffffffffffce8);
        }
      }
    }
    if (iVar3 == 0) {
      av1_free_pc_tree_recursive
                ((PC_TREE *)in_stack_fffffffffffffc20,
                 (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),(int)in_stack_fffffffffffffc18,
                 aiVar7[1],aiVar7[0]._3_1_);
    }
    *(int *)(local_70 + 0x4218) = iVar13;
  }
  local_21 = (_Bool)(local_1d4 & 1);
  return local_21;
}

Assistant:

bool av1_rd_pick_partition(AV1_COMP *const cpi, ThreadData *td,
                           TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                           int mi_col, BLOCK_SIZE bsize, RD_STATS *rd_cost,
                           RD_STATS best_rdc, PC_TREE *pc_tree,
                           SIMPLE_MOTION_DATA_TREE *sms_tree, int64_t *none_rd,
                           SB_MULTI_PASS_MODE multi_pass_mode,
                           RD_RECT_PART_WIN_INFO *rect_part_win_info) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  const TokenExtra *const tp_orig = *tp;
  PartitionSearchState part_search_state;

  // Initialization of state variables used in partition search.
  init_partition_search_state_params(x, cpi, &part_search_state, mi_row, mi_col,
                                     bsize);
  PartitionBlkParams blk_params = part_search_state.part_blk_params;

  set_sms_tree_partitioning(sms_tree, PARTITION_NONE);
  if (best_rdc.rdcost < 0) {
    av1_invalid_rd_stats(rd_cost);
    return part_search_state.found_best_partition;
  }
  if (bsize == cm->seq_params->sb_size) x->must_find_valid_partition = 0;

  // Override skipping rectangular partition operations for edge blocks.
  if (none_rd) *none_rd = 0;
  (void)*tp_orig;

#if CONFIG_COLLECT_PARTITION_STATS
  // Stats at the current quad tree
  PartitionTimingStats *part_timing_stats =
      &part_search_state.part_timing_stats;
  // Stats aggregated at frame level
  FramePartitionTimingStats *fr_part_timing_stats = &cpi->partition_stats;
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Override partition costs at the edges of the frame in the same
  // way as in read_partition (see decodeframe.c).
  if (!av1_blk_has_rows_and_cols(&blk_params))
    set_partition_cost_for_edge_blk(cm, &part_search_state);

  // Disable rectangular partitions for inner blocks when the current block is
  // forced to only use square partitions.
  if (bsize > cpi->sf.part_sf.use_square_partition_only_threshold) {
    part_search_state.partition_rect_allowed[HORZ] &= !blk_params.has_rows;
    part_search_state.partition_rect_allowed[VERT] &= !blk_params.has_cols;
  }

#ifndef NDEBUG
  // Nothing should rely on the default value of this array (which is just
  // leftover from encoding the previous block. Setting it to fixed pattern
  // when debugging.
  // bit 0, 1, 2 are blk_skip of each plane
  // bit 4, 5, 6 are initialization checking of each plane
  memset(x->txfm_search_info.blk_skip, 0x77,
         sizeof(x->txfm_search_info.blk_skip));
#endif  // NDEBUG

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);

  // Set buffers and offsets.
  av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, bsize);

  if (cpi->oxcf.mode == ALLINTRA) {
    if (bsize == cm->seq_params->sb_size) {
      double var_min, var_max;
      log_sub_block_var(cpi, x, bsize, &var_min, &var_max);

      x->intra_sb_rdmult_modifier = 128;
      if ((var_min < 2.0) && (var_max > 4.0)) {
        if ((var_max - var_min) > 8.0) {
          x->intra_sb_rdmult_modifier -= 48;
        } else {
          x->intra_sb_rdmult_modifier -= (int)((var_max - var_min) * 6);
        }
      }
    }
  }

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);

  // Apply simple motion search for the entire super block with fixed block
  // size, e.g., 16x16, to collect features and write to files for the
  // external ML model.
  // TODO(chengchen): reduce motion search. This function is similar to
  // av1_get_max_min_partition_features().
  if (COLLECT_MOTION_SEARCH_FEATURE_SB && !frame_is_intra_only(cm) &&
      bsize == cm->seq_params->sb_size) {
    av1_collect_motion_search_features_sb(cpi, td, tile_data, mi_row, mi_col,
                                          bsize, /*features=*/NULL);
    collect_tpl_stats_sb(cpi, bsize, mi_row, mi_col, /*features=*/NULL);
  }

  // Update rd cost of the bound using the current multiplier.
  av1_rd_cost_update(x->rdmult, &best_rdc);

  if (bsize == BLOCK_16X16 && cpi->vaq_refresh)
    x->mb_energy = av1_log_block_var(cpi, x, bsize);

  // Set the context.
  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_prune_partitions_time);
#endif
  // Pruning: before searching any partition type, using source and simple
  // motion search results to prune out unlikely partitions.
  av1_prune_partitions_before_search(cpi, x, sms_tree, &part_search_state);

  // Pruning: eliminating partition types leading to coding block sizes outside
  // the min and max bsize limitations set from the encoder.
  av1_prune_partitions_by_max_min_bsize(&x->sb_enc, &part_search_state);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_prune_partitions_time);
#endif

  // Partition search
BEGIN_PARTITION_SEARCH:
  // If a valid partition is required, usually when the first round cannot find
  // a valid one under the cost limit after pruning, reset the limitations on
  // partition types and intra cnn output.
  if (x->must_find_valid_partition) {
    reset_part_limitations(cpi, &part_search_state);
    av1_prune_partitions_by_max_min_bsize(&x->sb_enc, &part_search_state);
    // Invalidate intra cnn output for key frames.
    if (frame_is_intra_only(cm) && bsize == BLOCK_64X64) {
      part_search_state.intra_part_info->quad_tree_idx = 0;
      part_search_state.intra_part_info->cnn_output_valid = 0;
    }
  }
  // Partition block source pixel variance.
  unsigned int pb_source_variance = UINT_MAX;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, none_partition_search_time);
#endif

  if (cpi->oxcf.mode == ALLINTRA) {
    const bool bsize_at_least_16x16 = (bsize >= BLOCK_16X16);
    const bool prune_rect_part_using_4x4_var_deviation =
        (cpi->sf.part_sf.prune_rect_part_using_4x4_var_deviation &&
         !x->must_find_valid_partition);

    if (bsize_at_least_16x16 || prune_rect_part_using_4x4_var_deviation) {
      double var_min, var_max;
      log_sub_block_var(cpi, x, bsize, &var_min, &var_max);

      // Further pruning or in some cases reverse pruning when allintra is set.
      // This code helps visual and in some cases metrics quality where the
      // current block comprises at least one very low variance sub-block and at
      // least one where the variance is much higher.
      //
      // The idea is that in such cases there is danger of ringing and other
      // visual artifacts from a high variance feature such as an edge into a
      // very low variance region.
      //
      // The approach taken is to force break down / split to a smaller block
      // size to try and separate out the low variance and well predicted blocks
      // from the more complex ones and to prevent propagation of ringing over a
      // large region.
      if (bsize_at_least_16x16 && (var_min < 0.272) &&
          ((var_max - var_min) > 3.0)) {
        part_search_state.partition_none_allowed = 0;
        part_search_state.terminate_partition_search = 0;
        part_search_state.do_square_split = 1;
      } else if (prune_rect_part_using_4x4_var_deviation &&
                 (var_max - var_min < 3.0)) {
        // Prune rectangular partitions if the variance deviation of 4x4
        // sub-blocks within the block is less than a threshold (derived
        // empirically).
        part_search_state.do_rectangular_split = 0;
      }
    }
  }

  // PARTITION_NONE search stage.
  int64_t part_none_rd = INT64_MAX;
  none_partition_search(cpi, td, tile_data, x, pc_tree, sms_tree, &x_ctx,
                        &part_search_state, &best_rdc, &pb_source_variance,
                        none_rd, &part_none_rd);

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, none_partition_search_time);
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, split_partition_search_time);
#endif
  // PARTITION_SPLIT search stage.
  int64_t part_split_rd = INT64_MAX;
  split_partition_search(cpi, td, tile_data, tp, x, pc_tree, sms_tree, &x_ctx,
                         &part_search_state, &best_rdc, multi_pass_mode,
                         &part_split_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, split_partition_search_time);
#endif
  // Terminate partition search for child partition,
  // when NONE and SPLIT partition rd_costs are INT64_MAX.
  if (cpi->sf.part_sf.early_term_after_none_split &&
      part_none_rd == INT64_MAX && part_split_rd == INT64_MAX &&
      !x->must_find_valid_partition && (bsize != cm->seq_params->sb_size)) {
    part_search_state.terminate_partition_search = 1;
  }

  // Do not evaluate non-square partitions if NONE partition did not choose a
  // newmv mode and is skippable.
  if ((cpi->sf.part_sf.skip_non_sq_part_based_on_none >= 2) &&
      (pc_tree->none != NULL)) {
    if (x->qindex <= 200 && is_inter_mode(pc_tree->none->mic.mode) &&
        !have_newmv_in_inter_mode(pc_tree->none->mic.mode) &&
        pc_tree->none->skippable && !x->must_find_valid_partition &&
        bsize >= BLOCK_16X16)
      part_search_state.do_rectangular_split = 0;
  }

  // Prune partitions based on PARTITION_NONE and PARTITION_SPLIT.
  prune_partitions_after_split(cpi, x, sms_tree, &part_search_state, &best_rdc,
                               part_none_rd, part_split_rd);
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rectangular_partition_search_time);
#endif
  // Rectangular partitions search stage.
  rectangular_partition_search(cpi, td, tile_data, tp, x, pc_tree, &x_ctx,
                               &part_search_state, &best_rdc,
                               rect_part_win_info, HORZ, VERT);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rectangular_partition_search_time);
#endif

  if (pb_source_variance == UINT_MAX) {
    av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);
    pb_source_variance = av1_get_perpixel_variance_facade(
        cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  }

  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part_search_state.do_rectangular_split));

  const int prune_ext_part_state = prune_ext_part_none_skippable(
      pc_tree->none, x->must_find_valid_partition,
      cpi->sf.part_sf.skip_non_sq_part_based_on_none, bsize);

  const int ab_partition_allowed = allow_ab_partition_search(
      &part_search_state, &cpi->sf.part_sf, pc_tree->partitioning,
      x->must_find_valid_partition, prune_ext_part_state, best_rdc.rdcost);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, ab_partitions_search_time);
#endif
  // AB partitions search stage.
  ab_partitions_search(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       &part_search_state, &best_rdc, rect_part_win_info,
                       pb_source_variance, ab_partition_allowed, HORZ_A,
                       VERT_B);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, ab_partitions_search_time);
#endif

  // 4-way partitions search stage.
  int part4_search_allowed[NUM_PART4_TYPES] = { 1, 1 };
  // Prune 4-way partition search.
  prune_4_way_partition_search(cpi, x, pc_tree, &part_search_state, &best_rdc,
                               pb_source_variance, prune_ext_part_state,
                               part4_search_allowed);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rd_pick_4partition_time);
#endif
  // PARTITION_HORZ_4
  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part4_search_allowed[HORZ4]));
  if (!part_search_state.terminate_partition_search &&
      part4_search_allowed[HORZ4]) {
    const int inc_step[NUM_PART4_TYPES] = { mi_size_high[blk_params.bsize] / 4,
                                            0 };
    // Evaluation of Horz4 partition type.
    rd_pick_4partition(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       pc_tree->horizontal4, &part_search_state, &best_rdc,
                       inc_step, PARTITION_HORZ_4);
  }

  // PARTITION_VERT_4
  assert(IMPLIES(!cpi->oxcf.part_cfg.enable_rect_partitions,
                 !part4_search_allowed[VERT4]));
  if (!part_search_state.terminate_partition_search &&
      part4_search_allowed[VERT4] && blk_params.has_cols) {
    const int inc_step[NUM_PART4_TYPES] = { 0, mi_size_wide[blk_params.bsize] /
                                                   4 };
    // Evaluation of Vert4 partition type.
    rd_pick_4partition(cpi, td, tile_data, tp, x, &x_ctx, pc_tree,
                       pc_tree->vertical4, &part_search_state, &best_rdc,
                       inc_step, PARTITION_VERT_4);
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rd_pick_4partition_time);
#endif

  if (bsize == cm->seq_params->sb_size &&
      !part_search_state.found_best_partition) {
    // Did not find a valid partition, go back and search again, with less
    // constraint on which partition types to search.
    x->must_find_valid_partition = 1;
#if CONFIG_COLLECT_PARTITION_STATS
    fr_part_timing_stats->partition_redo += 1;
#endif  // CONFIG_COLLECT_PARTITION_STATS
    goto BEGIN_PARTITION_SEARCH;
  }

  // Store the final rd cost
  *rd_cost = best_rdc;

  // Also record the best partition in simple motion data tree because it is
  // necessary for the related speed features.
  set_sms_tree_partitioning(sms_tree, pc_tree->partitioning);

#if CONFIG_COLLECT_PARTITION_STATS
  if (best_rdc.rate < INT_MAX && best_rdc.dist < INT64_MAX) {
    part_timing_stats->partition_decisions[pc_tree->partitioning] += 1;
  }

  // If CONFIG_COLLECT_PARTITION_STATS is 1, then print out the stats for each
  // prediction block.
  print_partition_timing_stats_with_rdcost(
      part_timing_stats, mi_row, mi_col, bsize,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index],
      cm->current_frame.frame_number, &best_rdc, "part_timing.csv");
  const bool print_timing_stats = false;
  if (print_timing_stats) {
    print_partition_timing_stats(part_timing_stats, cm->show_frame,
                                 frame_is_intra_only(cm), bsize,
                                 "part_timing_data.csv");
  }
  // If CONFIG_COLLECTION_PARTITION_STATS is 2, then we print out the stats for
  // the whole clip. So we need to pass the information upstream to the encoder.
  accumulate_partition_timing_stats(fr_part_timing_stats, part_timing_stats,
                                    bsize);
#endif  // CONFIG_COLLECT_PARTITION_STATS

  // Reset the PC_TREE deallocation flag.
  int pc_tree_dealloc = 0;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_sb_time);
#endif
  if (part_search_state.found_best_partition) {
    if (bsize == cm->seq_params->sb_size) {
      // Encode the superblock.
      const int emit_output = multi_pass_mode != SB_DRY_PASS;
      const RUN_TYPE run_type = emit_output ? OUTPUT_ENABLED : DRY_RUN_NORMAL;

      // Write partition tree to file. Not used by default.
      if (COLLECT_MOTION_SEARCH_FEATURE_SB) {
        write_partition_tree(cpi, pc_tree, bsize, mi_row, mi_col);
        ++cpi->sb_counter;
      }

      set_cb_offsets(x->cb_offset, 0, 0);
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, run_type, bsize,
                pc_tree, NULL);
      assert(pc_tree == td->pc_root);
      // Dealloc the whole PC_TREE after a superblock is done.
      av1_free_pc_tree_recursive(pc_tree, num_planes, 0, 0,
                                 cpi->sf.part_sf.partition_search_type);
      pc_tree = NULL;
      td->pc_root = NULL;
      pc_tree_dealloc = 1;
    } else if (should_do_dry_run_encode_for_current_block(
                   cm->seq_params->sb_size, x->sb_enc.max_partition_size,
                   pc_tree->index, bsize)) {
      // Encode the smaller blocks in DRY_RUN mode.
      encode_sb(cpi, td, tile_data, tp, mi_row, mi_col, DRY_RUN_NORMAL, bsize,
                pc_tree, NULL);
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_sb_time);
#endif

  // If the tree still exists (non-superblock), dealloc most nodes, only keep
  // nodes for the best partition and PARTITION_NONE.
  if (pc_tree_dealloc == 0)
    av1_free_pc_tree_recursive(pc_tree, num_planes, 1, 1,
                               cpi->sf.part_sf.partition_search_type);

  if (bsize == cm->seq_params->sb_size) {
    assert(best_rdc.rate < INT_MAX);
    assert(best_rdc.dist < INT64_MAX);
  } else {
    assert(tp_orig == *tp);
  }

  // Restore the rd multiplier.
  x->rdmult = orig_rdmult;
  return part_search_state.found_best_partition;
}